

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32 *value)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint32 auStack_10 [2];
  
  puVar2 = this->buffer_;
  if ((puVar2 < this->buffer_end_) && (-1 < (char)*puVar2)) {
    *value = (int)(char)*puVar2;
    this->buffer_ = puVar2 + 1;
    return true;
  }
  pbVar4 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar4 < 10) && ((pbVar1 <= pbVar4 || ((char)pbVar1[-1] < '\0')))) {
    bVar3 = ReadVarint64Fallback(this,(uint64 *)auStack_10);
    if (bVar3) {
      *value = auStack_10[0];
    }
  }
  else {
    uVar5 = *pbVar4 & 0x7f;
    if ((char)*pbVar4 < '\0') {
      uVar5 = uVar5 | (pbVar4[1] & 0x7f) << 7;
      if ((char)pbVar4[1] < '\0') {
        uVar5 = uVar5 | (pbVar4[2] & 0x7f) << 0xe;
        if ((char)pbVar4[2] < '\0') {
          uVar5 = uVar5 | (pbVar4[3] & 0x7f) << 0x15;
          if ((char)pbVar4[3] < '\0') {
            uVar5 = uVar5 | (uint)pbVar4[4] << 0x1c;
            if ((char)pbVar4[4] < '\0') {
              pbVar4 = pbVar4 + 6;
              iVar6 = 5;
              while ((char)pbVar4[-1] < '\0') {
                pbVar4 = pbVar4 + 1;
                iVar6 = iVar6 + -1;
                if (iVar6 == 0) {
                  return false;
                }
              }
            }
            else {
              pbVar4 = pbVar4 + 5;
            }
          }
          else {
            pbVar4 = pbVar4 + 4;
          }
        }
        else {
          pbVar4 = pbVar4 + 3;
        }
      }
      else {
        pbVar4 = pbVar4 + 2;
      }
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    *value = uVar5;
    this->buffer_ = pbVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint32Fallback(value);
  }
}